

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O2

void __thiscall google::protobuf::io::Tokenizer::ConsumeLineComment(Tokenizer *this,string *content)

{
  if (content != (string *)0x0) {
    this->record_target_ = content;
    this->record_start_ = this->buffer_pos_;
  }
  while ((this->current_char_ != '\0' && (this->current_char_ != '\n'))) {
    NextChar(this);
  }
  TryConsume(this,'\n');
  if (content != (string *)0x0) {
    StopRecording(this);
    return;
  }
  return;
}

Assistant:

void Tokenizer::ConsumeLineComment(std::string* content) {
  if (content != nullptr) RecordTo(content);

  while (current_char_ != '\0' && current_char_ != '\n') {
    NextChar();
  }
  TryConsume('\n');

  if (content != nullptr) StopRecording();
}